

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

char * __thiscall ON_String::ReserveArray(ON_String *this,size_t array_capacity)

{
  char *pcVar1;
  void *pvVar2;
  char *pcVar3;
  uint uVar4;
  uint capacity;
  ON_Internal_Empty_aString *pOVar5;
  ON_Internal_Empty_aString *pOVar6;
  
  if (array_capacity == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pOVar6 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    if (this->m_s == (char *)0x0) {
      pOVar6 = &empty_astring;
    }
    if (array_capacity < 0xffffffff) {
      capacity = (uint)array_capacity;
      if (pOVar6 == &empty_astring) {
        CreateArray(this,capacity);
      }
      else if ((pOVar6->header).ref_count.super___atomic_base<int>._M_i < 2) {
        if ((pOVar6->header).string_capacity < (int)capacity) {
          pvVar2 = onrealloc(pOVar6,(long)(int)capacity + 0xd);
          this->m_s = (char *)((long)pvVar2 + 0xc);
          memset((void *)((long)pvVar2 + (long)*(int *)((long)pvVar2 + 8) + 0xc),0,
                 (long)(int)((capacity - *(int *)((long)pvVar2 + 8)) + 1));
          *(uint *)((long)pvVar2 + 8) = capacity;
        }
      }
      else {
        this->m_s = (char *)0x833064;
        CreateArray(this,capacity);
        uVar4 = (pOVar6->header).string_length;
        if ((int)capacity <= (int)uVar4) {
          uVar4 = capacity;
        }
        if (0 < (int)uVar4) {
          pOVar5 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
          if (this->m_s == (char *)0x0) {
            pOVar5 = &empty_astring;
          }
          memcpy(&pOVar5->s,&pOVar6->s,(ulong)uVar4);
          (pOVar5->header).string_length = uVar4;
        }
        LOCK();
        (pOVar6->header).ref_count.super___atomic_base<int>._M_i =
             (pOVar6->header).ref_count.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pOVar6->header).ref_count.super___atomic_base<int>._M_i == 0) {
          (pOVar6->header).string_length = 0;
          (pOVar6->header).string_capacity = 0;
          onfree(pOVar6);
        }
      }
      CopyArray(this);
      pcVar1 = this->m_s;
      pOVar6 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
      if (pcVar1 == (char *)0x0) {
        pOVar6 = &empty_astring;
      }
      pcVar3 = (char *)0x0;
      if (0 < (pOVar6->header).string_capacity) {
        pcVar3 = pcVar1;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string.cpp"
                 ,0x130,"","Requested capacity > ON_String::MaximumStringLength");
      pcVar3 = (char *)0x0;
    }
  }
  return pcVar3;
}

Assistant:

char* ON_String::ReserveArray( size_t array_capacity )
{
  if (array_capacity <= 0)
    return nullptr;

  ON_aStringHeader* hdr0 = Header();

  if (array_capacity > (size_t)ON_String::MaximumStringLength)
  {
    ON_ERROR("Requested capacity > ON_String::MaximumStringLength");
    return nullptr;
  }

  const int capacity = (int)array_capacity; // for 64 bit compiler
  if ( hdr0 == pEmptyStringHeader || nullptr == hdr0 ) 
  {
		CreateArray(capacity);
  }
  else if ( (int)(hdr0->ref_count) > 1 ) 
  {
    // Calling Create() here insures hdr0 remains valid until we decrement below.
    Create();

    // Allocate a new array
		CreateArray(capacity);
    ON_aStringHeader* hdr1 = Header();
    const int size = (capacity < hdr0->string_length) ? capacity : hdr0->string_length;
    if ( size > 0 ) 
    {
      memcpy( hdr1->string_array(), hdr0->string_array(), size*sizeof(*m_s) );
      hdr1->string_length = size;
    }
    // "this" no longer requires access to the original header
    // If we are in a multi-threaded situation and another thread
    // has decremented ref_count since the > 1 check above,
    // we might end up deleting hdr0.
    ON_aStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
	else if ( capacity > hdr0->string_capacity ) 
  {
		hdr0 = (ON_aStringHeader*)onrealloc( hdr0, sizeof(ON_aStringHeader) + (capacity+1)*sizeof(*m_s) );
    m_s = hdr0->string_array();
    memset( &m_s[hdr0->string_capacity], 0, (1 + capacity - hdr0->string_capacity)*sizeof(*m_s) );
    hdr0->string_capacity = capacity;
	}
  return Array();
}